

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cpio.c
# Opt level: O0

int header_odc(archive_read *a,cpio *cpio,archive_entry *entry,size_t *namelength,size_t *name_pad)

{
  int iVar1;
  void *pvVar2;
  dev_t dVar3;
  int64_t iVar4;
  archive_read *in_RCX;
  archive_read *in_RDX;
  long in_RSI;
  long in_RDI;
  cpio *in_R8;
  int r2;
  char *header;
  int r;
  void *h;
  size_t in_stack_ffffffffffffff68;
  archive_read *in_stack_ffffffffffffff70;
  archive_read *a_00;
  archive_read *in_stack_ffffffffffffff98;
  archive_read *entry_00;
  size_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  archive_entry *in_stack_ffffffffffffffc8;
  int local_4;
  
  *(undefined4 *)(in_RDI + 0x10) = 0x10001;
  *(char **)(in_RDI + 0x18) = "POSIX octet-oriented cpio";
  iVar1 = find_odc_header(in_stack_ffffffffffffff98);
  local_4 = iVar1;
  if (-0x15 < iVar1) {
    if (*(int *)(in_RDI + 0x10) == 0x10006) {
      local_4 = header_afiol(in_RCX,in_R8,in_stack_ffffffffffffffc8,
                             (size_t *)CONCAT44(iVar1,in_stack_ffffffffffffffc0),
                             in_stack_ffffffffffffffb8);
      if (local_4 == 0) {
        local_4 = iVar1;
      }
    }
    else {
      pvVar2 = __archive_read_ahead
                         (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(ssize_t *)0x1484e6);
      if (pvVar2 == (void *)0x0) {
        local_4 = -0x1e;
      }
      else {
        a_00 = in_RDX;
        dVar3 = atol8((char *)((long)pvVar2 + 6),6);
        archive_entry_set_dev((archive_entry *)a_00,dVar3);
        iVar4 = atol8((char *)((long)pvVar2 + 0xc),6);
        archive_entry_set_ino((archive_entry *)in_RDX,iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x12),6);
        archive_entry_set_mode((archive_entry *)in_RDX,(mode_t)iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x18),6);
        archive_entry_set_uid((archive_entry *)in_RDX,iVar4);
        iVar4 = atol8((char *)((long)pvVar2 + 0x1e),6);
        archive_entry_set_gid((archive_entry *)in_RDX,iVar4);
        entry_00 = in_RDX;
        iVar4 = atol8((char *)((long)pvVar2 + 0x24),6);
        archive_entry_set_nlink((archive_entry *)entry_00,(uint)iVar4);
        dVar3 = atol8((char *)((long)pvVar2 + 0x2a),6);
        archive_entry_set_rdev((archive_entry *)in_RDX,dVar3);
        iVar4 = atol8((char *)((long)pvVar2 + 0x30),0xb);
        archive_entry_set_mtime((archive_entry *)in_RDX,iVar4,0);
        iVar4 = atol8((char *)((long)pvVar2 + 0x3b),6);
        (in_RCX->archive).magic = (int)iVar4;
        (in_RCX->archive).state = (int)((ulong)iVar4 >> 0x20);
        *(undefined8 *)in_R8 = 0;
        iVar4 = atol8((char *)((long)pvVar2 + 0x41),0xb);
        *(int64_t *)(in_RSI + 0x18) = iVar4;
        archive_entry_set_size((archive_entry *)in_RDX,*(int64_t *)(in_RSI + 0x18));
        *(undefined8 *)(in_RSI + 0x30) = 0;
        __archive_read_consume(a_00,in_stack_ffffffffffffff68);
        local_4 = iVar1;
      }
    }
  }
  return local_4;
}

Assistant:

static int
header_odc(struct archive_read *a, struct cpio *cpio,
    struct archive_entry *entry, size_t *namelength, size_t *name_pad)
{
	const void *h;
	int r;
	const char *header;

	a->archive.archive_format = ARCHIVE_FORMAT_CPIO_POSIX;
	a->archive.archive_format_name = "POSIX octet-oriented cpio";

	/* Find the start of the next header. */
	r = find_odc_header(a);
	if (r < ARCHIVE_WARN)
		return (r);

	if (a->archive.archive_format == ARCHIVE_FORMAT_CPIO_AFIO_LARGE) {
		int r2 = (header_afiol(a, cpio, entry, namelength, name_pad));
		if (r2 == ARCHIVE_OK)
			return (r);
		else
			return (r2);
	}

	/* Read fixed-size portion of header. */
	h = __archive_read_ahead(a, odc_header_size, NULL);
	if (h == NULL)
	    return (ARCHIVE_FATAL);

	/* Parse out octal fields. */
	header = (const char *)h;

	archive_entry_set_dev(entry, 
		(dev_t)atol8(header + odc_dev_offset, odc_dev_size));
	archive_entry_set_ino(entry, atol8(header + odc_ino_offset, odc_ino_size));
	archive_entry_set_mode(entry, 
		(mode_t)atol8(header + odc_mode_offset, odc_mode_size));
	archive_entry_set_uid(entry, atol8(header + odc_uid_offset, odc_uid_size));
	archive_entry_set_gid(entry, atol8(header + odc_gid_offset, odc_gid_size));
	archive_entry_set_nlink(entry, 
		(unsigned int)atol8(header + odc_nlink_offset, odc_nlink_size));
	archive_entry_set_rdev(entry,
		(dev_t)atol8(header + odc_rdev_offset, odc_rdev_size));
	archive_entry_set_mtime(entry, atol8(header + odc_mtime_offset, odc_mtime_size), 0);
	*namelength = (size_t)atol8(header + odc_namesize_offset, odc_namesize_size);
	*name_pad = 0; /* No padding of filename. */

	/*
	 * Note: entry_bytes_remaining is at least 64 bits and
	 * therefore guaranteed to be big enough for a 33-bit file
	 * size.
	 */
	cpio->entry_bytes_remaining =
	    atol8(header + odc_filesize_offset, odc_filesize_size);
	archive_entry_set_size(entry, cpio->entry_bytes_remaining);
	cpio->entry_padding = 0;
	__archive_read_consume(a, odc_header_size);
	return (r);
}